

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerNewConcatStrMulti(Lowerer *this,Instr *instr)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  uint32 value;
  Opnd *pOVar4;
  IntConstOpnd *this_00;
  RegOpnd *newObjDst;
  undefined4 *puVar5;
  size_t allocSize;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  pOVar4 = IR::Instr::UnlinkSrc1(instr);
  this_00 = IR::Opnd::AsIntConstOpnd(pOVar4);
  pOVar4 = IR::Instr::UnlinkDst(instr);
  newObjDst = IR::Opnd::AsRegOpnd(pOVar4);
  lVar1 = (this_00->super_EncodableOpnd<long>).m_value;
  local_32 = (newObjDst->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::IsString((ValueType *)&local_32.field_0);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x65c2,"(dstOpnd->GetValueType().IsString())",
                       "dstOpnd->GetValueType().IsString()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  allocSize = Js::ConcatStringMulti::GetAllocSize((uint)lVar1 & 0xff);
  GenerateRecyclerAlloc(this,HelperAllocMemForConcatStringMulti,allocSize,newObjDst,instr,false);
  pOVar4 = LoadVTableValueOpnd(this,instr,VtableConcatStringMulti);
  GenerateRecyclerMemInit(this,newObjDst,0,pOVar4,instr);
  pOVar4 = LoadLibraryValueOpnd(this,instr,ValueStringTypeStatic);
  GenerateRecyclerMemInit(this,newObjDst,8,pOVar4,instr);
  GenerateRecyclerMemInit(this,newObjDst,0x18,0,instr);
  value = IR::IntConstOpnd::AsUint32(this_00);
  GenerateRecyclerMemInit(this,newObjDst,0x1c,value,instr);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::LowerNewConcatStrMulti(IR::Instr * instr)
{
    IR::IntConstOpnd * countOpnd = instr->UnlinkSrc1()->AsIntConstOpnd();
    IR::RegOpnd * dstOpnd = instr->UnlinkDst()->AsRegOpnd();
    uint8 count = (uint8)countOpnd->GetValue();

    Assert(dstOpnd->GetValueType().IsString());

    GenerateRecyclerAlloc(IR::HelperAllocMemForConcatStringMulti, Js::ConcatStringMulti::GetAllocSize(count), dstOpnd, instr);

    GenerateRecyclerMemInit(dstOpnd, 0, this->LoadVTableValueOpnd(instr, VTableValue::VtableConcatStringMulti), instr);
    GenerateRecyclerMemInit(dstOpnd, Js::ConcatStringMulti::GetOffsetOfType(),
        this->LoadLibraryValueOpnd(instr, LibraryValue::ValueStringTypeStatic), instr);
    GenerateRecyclerMemInitNull(dstOpnd, Js::ConcatStringMulti::GetOffsetOfpszValue(), instr);
    GenerateRecyclerMemInit(dstOpnd, Js::ConcatStringMulti::GetOffsetOfcharLength(), 0, instr);
    GenerateRecyclerMemInit(dstOpnd, Js::ConcatStringMulti::GetOffsetOfSlotCount(), countOpnd->AsUint32(), instr);

    instr->Remove();
}